

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O3

int mbedtls_aesni_setkey_enc(uchar *rk,uchar *key,size_t bits)

{
  undefined8 uVar1;
  int iVar2;
  
  if (bits == 0x100) {
    uVar1 = *(undefined8 *)(key + 8);
    *(undefined8 *)rk = *(undefined8 *)key;
    *(undefined8 *)(rk + 8) = uVar1;
    uVar1 = *(undefined8 *)(key + 0x18);
    *(undefined8 *)(rk + 0x10) = *(undefined8 *)(key + 0x10);
    *(undefined8 *)(rk + 0x18) = uVar1;
    iVar2 = FUN_0010d127();
    return iVar2;
  }
  if (bits != 0xc0) {
    if (bits == 0x80) {
      uVar1 = *(undefined8 *)(key + 8);
      *(undefined8 *)rk = *(undefined8 *)key;
      *(undefined8 *)(rk + 8) = uVar1;
      iVar2 = FUN_0010cf7f();
      return iVar2;
    }
    return -0x20;
  }
  uVar1 = *(undefined8 *)(key + 8);
  *(undefined8 *)rk = *(undefined8 *)key;
  *(undefined8 *)(rk + 8) = uVar1;
  *(undefined8 *)(rk + 0x10) = *(undefined8 *)(key + 0x10);
  iVar2 = FUN_0010d054(rk + 0x18);
  return iVar2;
}

Assistant:

int mbedtls_aesni_setkey_enc( unsigned char *rk,
                      const unsigned char *key,
                      size_t bits )
{
    switch( bits )
    {
        case 128: aesni_setkey_enc_128( rk, key ); break;
        case 192: aesni_setkey_enc_192( rk, key ); break;
        case 256: aesni_setkey_enc_256( rk, key ); break;
        default : return( MBEDTLS_ERR_AES_INVALID_KEY_LENGTH );
    }

    return( 0 );
}